

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void biffseekeof(bifcxdef *ctx,int argc)

{
  FILE *__stream;
  
  __stream = (FILE *)bif_get_file(ctx,(int *)0x0,(int *)0x0);
  fseek(__stream,0,2);
  return;
}

Assistant:

void biffseekeof(bifcxdef *ctx, int argc)
{
    osfildef *fp;

    /* get the file pointer */
    bifcntargs(ctx, 1, argc);
    fp = bif_get_file(ctx, (int *)0, 0);

    /* seek to the end */
    osfseek(fp, 0L, OSFSK_END);
}